

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O2

boolean check_capacity(char *str)

{
  boolean bVar1;
  uint uVar2;
  char *line;
  
  uVar2 = near_capacity();
  if (uVar2 < 4) {
    bVar1 = '\0';
  }
  else {
    line = "You can\'t do that while carrying so much stuff.";
    if (str != (char *)0x0) {
      line = str;
    }
    pline(line);
    bVar1 = '\x01';
  }
  return bVar1;
}

Assistant:

boolean check_capacity(const char *str)
{
    if (near_capacity() >= EXT_ENCUMBER) {
	if (str)
	    pline(str);
	else
	    pline("You can't do that while carrying so much stuff.");
	return 1;
    }
    return 0;
}